

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlogin.c
# Opt level: O1

void rlogin_receive(Plug *plug,int urgent,char *data,size_t len)

{
  ulong uVar1;
  
  if ((len != 0) && (urgent != 2)) {
    if (*(char *)((long)&plug[-8].vt + 1) == '\x01') {
      len = len - (*data == '\0');
      data = data + (*data == '\0');
      *(undefined1 *)((long)&plug[-8].vt + 1) = 0;
    }
    if (len != 0) {
      uVar1 = (**(code **)(plug[-6].vt)->log)(plug[-6].vt,0,data);
      (**(code **)((plug[-10].vt)->log + 0x28))(plug[-10].vt,0x1000 < uVar1);
      return;
    }
  }
  return;
}

Assistant:

static void rlogin_receive(
    Plug *plug, int urgent, const char *data, size_t len)
{
    Rlogin *rlogin = container_of(plug, Rlogin, plug);
    if (len == 0)
        return;
    if (urgent == 2) {
        char c;

        c = *data++;
        len--;
        if (c == '\x80') {
            rlogin->cansize = true;
            backend_size(&rlogin->backend,
                         rlogin->term_width, rlogin->term_height);
        }
        /*
         * We should flush everything (aka Telnet SYNCH) if we see
         * 0x02, and we should turn off and on _local_ flow control
         * on 0x10 and 0x20 respectively. I'm not convinced it's
         * worth it...
         */
    } else {
        /*
         * Main rlogin protocol. This is really simple: the first
         * byte is expected to be NULL and is ignored, and the rest
         * is printed.
         */
        if (rlogin->firstbyte) {
            if (data[0] == '\0') {
                data++;
                len--;
            }
            rlogin->firstbyte = false;
        }
        if (len > 0)
            c_write(rlogin, data, len);
    }
}